

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O2

void __thiscall GGWave::GGWave(GGWave *this,Parameters *parameters)

{
  this->m_sampleRateInp = -1.0;
  this->m_sampleRateOut = -1.0;
  this->m_sampleRate = -1.0;
  this->m_samplesPerFrame = -1;
  this->m_isamplesPerFrame = -1.0;
  this->m_sampleSizeInp = -1;
  this->m_sampleSizeOut = -1;
  this->m_sampleFormatInp = GGWAVE_SAMPLE_FORMAT_UNDEFINED;
  this->m_sampleFormatOut = GGWAVE_SAMPLE_FORMAT_UNDEFINED;
  this->m_hzPerSample = -1.0;
  this->m_ihzPerSample = -1.0;
  this->m_freqDelta_bin = -1;
  this->m_freqDelta_hz = -1.0;
  this->m_nBitsInMarker = -1;
  this->m_nMarkerFrames = -1;
  this->m_encodedDataOffset = -1;
  this->m_soundMarkerThreshold = -1.0;
  this->m_isFixedPayloadLength = false;
  this->m_payloadLength = -1;
  this->m_isRxEnabled = false;
  this->m_isTxEnabled = false;
  this->m_needResampling = false;
  this->m_txOnlyTones = false;
  (this->m_dataEncoded).m_data = (uchar *)0x0;
  (this->m_dataEncoded).m_size = 0;
  (this->m_workRSLength).m_data = (uchar *)0x0;
  (this->m_workRSLength).m_size = 0;
  (this->m_workRSData).m_data = (uchar *)0x0;
  (this->m_workRSData).m_size = 0;
  this->m_isDSSEnabled = false;
  Rx::Rx(&this->m_rx);
  Tx::Tx(&this->m_tx);
  Resampler::Resampler(&this->m_resampler);
  this->m_heap = (void *)0x0;
  this->m_heapSize = 0;
  prepare(this,parameters,true);
  return;
}

Assistant:

GGWave::GGWave(const Parameters & parameters) {
    prepare(parameters);
}